

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O2

void __thiscall
TEST_MemoryLeakDetectorTest_OneLeakUsingOperatorNewWithFileLine_TestShell::
~TEST_MemoryLeakDetectorTest_OneLeakUsingOperatorNewWithFileLine_TestShell
          (TEST_MemoryLeakDetectorTest_OneLeakUsingOperatorNewWithFileLine_TestShell *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, OneLeakUsingOperatorNewWithFileLine)
{
    char* mem = detector->allocMemory(defaultNewAllocator(), 4, "file.cpp", 1234);
    detector->stopChecking();
    SimpleString output = detector->report(mem_leak_period_checking);
    CHECK(output.contains("file.cpp"));
    CHECK(output.contains("1234"));
    PlatformSpecificFree(mem);
}